

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O1

void __thiscall google::FlagSaverImpl::SaveFromRegistry(FlagSaverImpl *this)

{
  Mutex *pMVar1;
  pointer *pppCVar2;
  int iVar3;
  FlagRegistry *pFVar4;
  CommandLineFlag *src;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  pointer __src;
  CommandLineFlag *this_00;
  FlagValue *pFVar8;
  FlagValue *pFVar9;
  ulong uVar10;
  pointer ppCVar11;
  _Rb_tree_node_base *p_Var12;
  ulong uVar13;
  size_t __n;
  ulong uVar14;
  
  pFVar4 = this->main_registry_;
  pMVar1 = &pFVar4->lock_;
  iVar3 = pMVar1->mutex_;
  pMVar1->mutex_ = pMVar1->mutex_ + -1;
  if (iVar3 != 0) {
    __assert_fail("--mutex_ == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/mutex.h"
                  ,0xde,"void gflags_mutex_namespace::Mutex::Lock()");
  }
  if ((this->backup_registry_).
      super__Vector_base<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->backup_registry_).
      super__Vector_base<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("backup_registry_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/gflags.cc"
                  ,0x678,"void google::FlagSaverImpl::SaveFromRegistry()");
  }
  p_Var12 = (pFVar4->flags_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var12 !=
      &(this->main_registry_->flags_)._M_t._M_impl.super__Rb_tree_header) {
    do {
      src = (CommandLineFlag *)p_Var12[1]._M_parent;
      this_00 = (CommandLineFlag *)operator_new(0x38);
      pcVar5 = src->name_;
      pcVar6 = src->help_;
      pcVar7 = src->file_;
      pFVar8 = anon_unknown_1::FlagValue::New(src->current_);
      pFVar9 = anon_unknown_1::FlagValue::New(src->defvalue_);
      this_00->name_ = pcVar5;
      this_00->help_ = pcVar6;
      this_00->file_ = pcVar7;
      this_00->modified_ = false;
      this_00->defvalue_ = pFVar9;
      this_00->current_ = pFVar8;
      this_00->validate_fn_proto_ = (ValidateFnProto)0x0;
      anon_unknown_1::CommandLineFlag::CopyFrom(this_00,src);
      ppCVar11 = (this->backup_registry_).
                 super__Vector_base<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (ppCVar11 ==
          (this->backup_registry_).
          super__Vector_base<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        __src = (this->backup_registry_).
                super__Vector_base<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
        __n = (long)ppCVar11 - (long)__src;
        if (__n == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar14 = (long)__n >> 3;
        uVar10 = uVar14;
        if (ppCVar11 == __src) {
          uVar10 = 1;
        }
        uVar13 = uVar10 + uVar14;
        if (0xffffffffffffffe < uVar13) {
          uVar13 = 0xfffffffffffffff;
        }
        if (CARRY8(uVar10,uVar14)) {
          uVar13 = 0xfffffffffffffff;
        }
        if (uVar13 == 0) {
          ppCVar11 = (pointer)0x0;
        }
        else {
          ppCVar11 = (pointer)operator_new(uVar13 * 8);
        }
        ppCVar11[uVar14] = this_00;
        if (0 < (long)__n) {
          memmove(ppCVar11,__src,__n);
        }
        if (__src != (pointer)0x0) {
          operator_delete(__src);
        }
        (this->backup_registry_).
        super__Vector_base<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
        ._M_impl.super__Vector_impl_data._M_start = ppCVar11;
        (this->backup_registry_).
        super__Vector_base<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)ppCVar11 + __n + 8);
        (this->backup_registry_).
        super__Vector_base<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = ppCVar11 + uVar13;
      }
      else {
        *ppCVar11 = this_00;
        pppCVar2 = &(this->backup_registry_).
                    super__Vector_base<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppCVar2 = *pppCVar2 + 1;
      }
      p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
    } while ((_Rb_tree_header *)p_Var12 !=
             &(this->main_registry_->flags_)._M_t._M_impl.super__Rb_tree_header);
  }
  pMVar1 = &pFVar4->lock_;
  pMVar1->mutex_ = pMVar1->mutex_ + 1;
  if (pMVar1->mutex_ != 0) {
    __assert_fail("mutex_++ == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/mutex.h"
                  ,0xdf,"void gflags_mutex_namespace::Mutex::Unlock()");
  }
  return;
}

Assistant:

void SaveFromRegistry() {
    FlagRegistryLock frl(main_registry_);
    assert(backup_registry_.empty());   // call only once!
    for (FlagRegistry::FlagConstIterator it = main_registry_->flags_.begin();
         it != main_registry_->flags_.end();
         ++it) {
      const CommandLineFlag* main = it->second;
      // Sets up all the const variables in backup correctly
      CommandLineFlag* backup = new CommandLineFlag(
          main->name(), main->help(), main->filename(),
          main->current_->New(), main->defvalue_->New());
      // Sets up all the non-const variables in backup correctly
      backup->CopyFrom(*main);
      backup_registry_.push_back(backup);   // add it to a convenient list
    }
  }